

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

void __thiscall
Centaurus::LookaheadDFA<char>::LookaheadDFA
          (LookaheadDFA<char> *this,CompositeATN<char> *catn,ATNPath *origin,bool optimize_flag)

{
  bool bVar1;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> *this_00;
  NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
  *this_01;
  LDFAState<char> *state;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> *__range2;
  CATNClosure local_58;
  byte local_21;
  ATNPath *pAStack_20;
  bool optimize_flag_local;
  ATNPath *origin_local;
  CompositeATN<char> *catn_local;
  LookaheadDFA<char> *this_local;
  
  local_21 = optimize_flag;
  pAStack_20 = origin;
  origin_local = (ATNPath *)catn;
  catn_local = (CompositeATN<char> *)this;
  NFABase<Centaurus::LDFAState<char>_>::NFABase(&this->super_NFABase<Centaurus::LDFAState<char>_>);
  (this->super_NFABase<Centaurus::LDFAState<char>_>)._vptr_NFABase =
       (_func_int **)&PTR__LookaheadDFA_0028a9e8;
  CompositeATN<char>::build_root_closure(&local_58,(CompositeATN<char> *)origin_local,pAStack_20);
  std::vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>>::
  emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>
            ((vector<Centaurus::LDFAState<char>,std::allocator<Centaurus::LDFAState<char>>> *)
             &(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states,&local_58);
  std::
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::~set(&local_58);
  fork_closures(this,(CompositeATN<char> *)origin_local,0);
  this_00 = &(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states;
  __end0 = std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
           begin(this_00);
  state = (LDFAState<char> *)
          std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::end
                    (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Centaurus::LDFAState<char>_*,_std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>_>
                                *)&state);
    if (!bVar1) break;
    this_01 = &__gnu_cxx::
               __normal_iterator<Centaurus::LDFAState<char>_*,_std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>_>
               ::operator*(&__end0)->
               super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
    ;
    NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
    ::sort(this_01);
    __gnu_cxx::
    __normal_iterator<Centaurus::LDFAState<char>_*,_std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>_>
    ::operator++(&__end0);
  }
  if ((local_21 & 1) != 0) {
    minimize(this);
  }
  return;
}

Assistant:

LookaheadDFA(const CompositeATN<TCHAR>& catn, const ATNPath& origin, bool optimize_flag = true)
	{
		m_states.emplace_back(catn.build_root_closure(origin));

		fork_closures(catn, 0);

        for (auto& state : m_states)
            state.sort();

        if (optimize_flag)
            minimize();
	}